

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QVariant>::data(QList<QVariant> *this)

{
  QArrayDataPointer<QVariant> *this_00;
  QVariant *pQVar1;
  QArrayDataPointer<QVariant> *in_RDI;
  
  detach((QList<QVariant> *)0x124a7c);
  this_00 = (QArrayDataPointer<QVariant> *)QArrayDataPointer<QVariant>::operator->(in_RDI);
  pQVar1 = QArrayDataPointer<QVariant>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }